

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

int __thiscall GrcErrorList::ErrorsAtLine(GrcErrorList *this,int nLine,int *piperrFirst)

{
  int iVar1;
  size_type_conflict sVar2;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  int cperr;
  int iperrFirst;
  int local_28;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::size
                      ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8));
    bVar3 = false;
    if (local_24 < (int)sVar2) {
      std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::operator[]
                ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8),
                 (long)local_24);
      iVar1 = GrcErrorItem::PreProcessedLine((GrcErrorItem *)0x1abac5);
      bVar3 = iVar1 < in_ESI;
    }
    if (!bVar3) break;
    local_24 = local_24 + 1;
  }
  sVar2 = std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::size
                    ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8));
  if (local_24 < (int)sVar2) {
    std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::operator[]
              ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8),
               (long)local_24);
    iVar1 = GrcErrorItem::PreProcessedLine((GrcErrorItem *)0x1abb2b);
    if (iVar1 <= in_ESI) {
      local_28 = 1;
      while( true ) {
        sVar2 = std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::size
                          ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8));
        bVar3 = false;
        if (local_24 + local_28 < (int)sVar2) {
          std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::operator[]
                    ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)(in_RDI + 8),
                     (long)(local_24 + local_28));
          iVar1 = GrcErrorItem::PreProcessedLine((GrcErrorItem *)0x1abb9e);
          bVar3 = iVar1 == in_ESI;
        }
        if (!bVar3) break;
        local_28 = local_28 + 1;
      }
      *in_RDX = local_24;
      return local_28;
    }
  }
  *in_RDX = -1;
  return 0;
}

Assistant:

int GrcErrorList::ErrorsAtLine(int nLine, int * piperrFirst)
{
	int iperrFirst = 0;
	while (iperrFirst < signed(m_vperr.size()) && m_vperr[iperrFirst]->PreProcessedLine() < nLine)
		iperrFirst++;

	if (iperrFirst >= signed(m_vperr.size()) || nLine < m_vperr[iperrFirst]->PreProcessedLine())
	{
		*piperrFirst = -1;
		return 0;
	}

	int cperr = 1;
	while (iperrFirst + cperr < signed(m_vperr.size()) &&
		m_vperr[iperrFirst + cperr]->PreProcessedLine() == nLine)
	{
		cperr++;
	}

	*piperrFirst = iperrFirst;
	return cperr;
}